

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.hpp
# Opt level: O2

string * __thiscall
cinatra::cookie::to_string_abi_cxx11_(string *__return_storage_ptr__,cookie *this)

{
  long lVar1;
  time_t tVar2;
  char *__s;
  string local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,0x100);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,&this->name_);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"=");
  if (this->version_ == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&this->value_);
    if ((this->domain_)._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; domain=");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&this->domain_);
    }
    if ((this->path_)._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; path=");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&this->path_);
    }
    if ((this->priority_)._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; Priority=");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&this->priority_);
    }
    if (this->max_age_ != -1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; expires=");
      lVar1 = this->max_age_;
      tVar2 = time((time_t *)0x0);
      local_38._0_16_ = get_gmt_time_str((time_point)((tVar2 + lVar1) * 1000000000));
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)__return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_38);
    }
    if (this->secure_ == true) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; secure");
    }
    if (this->http_only_ == false) {
      return __return_storage_ptr__;
    }
    __s = "; HttpOnly";
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\"");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&this->value_);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\"");
    if ((this->comment_)._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; Comment=\"");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&this->comment_);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"\"");
    }
    if ((this->domain_)._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; Domain=\"");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&this->domain_);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"\"");
    }
    if ((this->path_)._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; Path=\"");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&this->path_);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"\"");
    }
    if ((this->priority_)._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; Priority=\"");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&this->priority_);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"\"");
    }
    if (this->max_age_ != -1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; Max-Age=\"");
      std::__cxx11::to_string(&local_38,this->max_age_);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"\"");
    }
    if (this->secure_ == true) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; secure");
    }
    __s = "; Version=\"1\"";
    if (this->http_only_ == true) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"; HttpOnly");
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,__s);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const {
    std::string result;
    result.reserve(256);
    result.append(name_);
    result.append("=");
    if (version_ == 0) {
      // Netscape cookie
      result.append(value_);
      if (!domain_.empty()) {
        result.append("; domain=");
        result.append(domain_);
      }
      if (!path_.empty()) {
        result.append("; path=");
        result.append(path_);
      }
      if (!priority_.empty()) {
        result.append("; Priority=");
        result.append(priority_);
      }
      if (max_age_ != -1) {
        result.append("; expires=");
        result.append(get_gmt_time_str(std::chrono::system_clock::from_time_t(
            max_age_ + std::time(nullptr))));
      }
      if (secure_) {
        result.append("; secure");
      }
      if (http_only_) {
        result.append("; HttpOnly");
      }
    }
    else {
      // RFC 2109 cookie
      result.append("\"");
      result.append(value_);
      result.append("\"");
      if (!comment_.empty()) {
        result.append("; Comment=\"");
        result.append(comment_);
        result.append("\"");
      }
      if (!domain_.empty()) {
        result.append("; Domain=\"");
        result.append(domain_);
        result.append("\"");
      }
      if (!path_.empty()) {
        result.append("; Path=\"");
        result.append(path_);
        result.append("\"");
      }
      if (!priority_.empty()) {
        result.append("; Priority=\"");
        result.append(priority_);
        result.append("\"");
      }

      if (max_age_ != -1) {
        result.append("; Max-Age=\"");
        result.append(std::to_string(max_age_));
        result.append("\"");
      }
      if (secure_) {
        result.append("; secure");
      }
      if (http_only_) {
        result.append("; HttpOnly");
      }
      result.append("; Version=\"1\"");
    }
    return result;
  }